

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O0

void __thiscall
Well<unsigned_int,32ul,624ul,31ul,203ul,613ul,123ul,Detail::M3<7>,Detail::M1,Detail::M3<12>,Detail::M3<-10>,Detail::M3<-19>,Detail::M2<-11>,Detail::M3<4>,Detail::M3<-10>,Detail::NoTempering>
::seed<unsigned_int*>
          (Well<unsigned_int,32ul,624ul,31ul,203ul,613ul,123ul,Detail::M3<7>,Detail::M1,Detail::M3<12>,Detail::M3<_10>,Detail::M3<_19>,Detail::M2<_11>,Detail::M3<4>,Detail::M3<_10>,Detail::NoTempering>
           *this,uint **first,uint *last)

{
  invalid_argument *this_00;
  bool bVar1;
  long local_28;
  size_t i;
  uint *last_local;
  uint **first_local;
  Well<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_Detail::M3<7>,_Detail::M1,_Detail::M3<12>,_Detail::M3<_10>,_Detail::M3<_19>,_Detail::M2<_11>,_Detail::M3<4>,_Detail::M3<_10>,_Detail::NoTempering>
  *this_local;
  
  *(undefined8 *)(this + 0x9c0) = 0;
  local_28 = 0;
  while( true ) {
    bVar1 = false;
    if (local_28 != 0x270) {
      bVar1 = *first != last;
    }
    if (!bVar1) break;
    *(uint *)(this + local_28 * 4) = **first;
    local_28 = local_28 + 1;
    *first = *first + 1;
  }
  if ((*first == last) && (local_28 != 0x270)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Seed sequence too short");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

void seed(InputIterator& first, InputIterator last)
    {
        index_ = 0;
        std::size_t i = 0;

        for ( ; i != state_size && first != last; ++i, ++first)
            state_[i] = *first;

        if (first == last && i != state_size)
            throw std::invalid_argument("Seed sequence too short");
    }